

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  pair<unsigned_short,_const_void_*> ts;
  pair<unsigned_short,_const_void_*> ts_00;
  uint8_t buff [6];
  uint8_t buff2 [20];
  
  logger.mLogful = true;
  buff[4] = 0xca;
  buff[5] = 0xfe;
  buff[0] = 0xde;
  buff[1] = 0xad;
  buff[2] = 0xbe;
  buff[3] = 0xef;
  buff2[0] = 0xde;
  buff2[1] = 0xad;
  buff2[2] = 0xbe;
  buff2[3] = 0xef;
  buff2[4] = 0xde;
  buff2[5] = 0xca;
  buff2[6] = 0xf8;
  buff2[7] = 0xed;
  buff2[8] = 0xca;
  buff2[9] = 0xfe;
  buff2[10] = 0xde;
  buff2[0xb] = 0xad;
  buff2[0xc] = 0xbe;
  buff2[0xd] = 0xef;
  buff2[0xe] = 0xde;
  buff2[0xf] = 0xca;
  buff2[0x10] = 0xf8;
  buff2[0x11] = 0xed;
  buff2[0x12] = 0xca;
  buff2[0x13] = 0xfe;
  ts.second = buff2;
  ts._0_8_ = 0x14;
  Logless<std::pair<unsigned_short,void_const*>>(&logger,"Log me pls %%;",ts);
  Logless<signed_char,signed_char,signed_char>(&logger,"Log me pls %c; and %d; and %x;",'a','a','a')
  ;
  Logless<signed_char,signed_char>(&logger,"Log me pl  %d; and %x;",'a','a');
  Logless<unsigned_char>(&logger,"Log me pls %u;",'a');
  Logless<short>(&logger,"Log me pls %d;",-1);
  Logless<unsigned_short>(&logger,"Log me pls %u;",0xffff);
  Logless<int>(&logger,"Log me pls %d;",-1);
  Logless<unsigned_int>(&logger,"Log me pls %u;",0xffffffff);
  Logless<long>(&logger,"Log me pls %zd;",-1);
  Logless<unsigned_long>(&logger,"Log me pls %zu;",0xffffffffffffffff);
  Logless<float>(&logger,"Log me pls %f;",4.2);
  Logless<double>(&logger,"Log me pls %lf;",4.2);
  ts_00.second = buff;
  ts_00._0_8_ = 6;
  Logless<std::pair<unsigned_short,void_const*>>(&logger,"Log me pls %%;",ts_00);
  Logless<char_const*>(&logger,"Log me pls %s;","this iz string");
  runBM();
  Logger::flush(&logger);
  return 0;
}

Assistant:

int main()
{
    logger.logful();
    uint8_t buff[] = {0xde,0xad,0xbe,0xef,0xca,0xfe};
    uint8_t buff2[] = {0xde,0xad,0xbe,0xef,0xde,0xca,0xf8,0xed,0xca,0xfe,0xde,0xad,0xbe,0xef,0xde,0xca,0xf8,0xed,0xca,0xfe};

    Logless(logger, "Log me pls %%;", BufferLog(20, buff2));
    Logless(logger, "Log me pls %c; and %d; and %x;", int8_t('a'), int8_t('a'), int8_t('a'));
    Logless(logger, "Log me pl  %d; and %x;", int8_t('a'), int8_t('a'));
    Logless(logger, "Log me pls %u;", uint8_t('a'));
    Logless(logger, "Log me pls %d;", int16_t(0xffff));
    Logless(logger, "Log me pls %u;", uint16_t(0xffff));
    Logless(logger, "Log me pls %d;", int32_t(0xffffffff));
    Logless(logger, "Log me pls %u;", uint32_t(0xffffffff));
    Logless(logger, "Log me pls %zd;", int64_t(0xfffffffffffffffful));
    Logless(logger, "Log me pls %zu;", uint64_t(0xfffffffffffffffful));
    Logless(logger, "Log me pls %f;", float(4.2));
    Logless(logger, "Log me pls %lf;", double(4.2));
    Logless(logger, "Log me pls %%;", BufferLog(6, buff));
    Logless(logger, "Log me pls %s;", "this iz string");

    runBM();

    logger.flush();
}